

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

bool __thiscall TURBOLINECOUNT::CLineCount::createThread(CLineCount *this,int thread_number)

{
  int iVar1;
  pthread_t in_RAX;
  int *__arg;
  pthread_t hThread;
  
  hThread = in_RAX;
  __arg = (int *)operator_new(0x10);
  *(CLineCount **)(__arg + 2) = this;
  *__arg = thread_number;
  iVar1 = pthread_create(&hThread,(pthread_attr_t *)0x0,threadProc,__arg);
  if (iVar1 == 0) {
    (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[thread_number] = hThread;
  }
  return iVar1 == 0;
}

Assistant:

bool CLineCount::createThread(int thread_number)
{
	LCTHREADCONTEXT * ctx = new LCTHREADCONTEXT;
	ctx->m_this = this;
	ctx->thread_number = thread_number;
#ifdef _WIN32
	HANDLE hThread = CreateThread(NULL, 0, threadProc, ctx, 0, NULL);
	if(!hThread)
	{
		return false;
	}
#else
	pthread_t hThread;
	int ret = pthread_create(&hThread, NULL, threadProc, ctx);
	if (ret != 0)
	{
		return false;
	}
#endif
	m_threads[thread_number] = hThread;
	return true;
}